

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O0

bool __thiscall TxReconciliationTracker::Impl::IsPeerRegistered(Impl *this,NodeId peer_id)

{
  long lVar1;
  bool bVar2;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RDI;
  long in_FS_OFFSET;
  const_iterator recon_state;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock15;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar3;
  char *__x;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffc0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __x = "m_txreconciliation_mutex";
  this_00 = in_RDI;
  AssertLockNotHeldInline
            ("m_txreconciliation_mutex",
             (char *)CONCAT17(in_stack_ffffffffffffff97,
                              CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
             in_stack_ffffffffffffff8c,(Mutex *)0x121f75c);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (this_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::
  unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
  ::find((unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
          *)CONCAT17(in_stack_ffffffffffffff97,
                     CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
         (key_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::
  unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
  ::end((unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
         *)CONCAT17(in_stack_ffffffffffffff97,
                    CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
  bVar2 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                      *)__x,(_Node_iterator_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                             *)CONCAT17(in_stack_ffffffffffffff97,
                                        CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90
                                                )));
  bVar3 = false;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::__detail::
    _Node_const_iterator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false,_false>
    ::operator->((_Node_const_iterator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    bVar3 = std::
            holds_alternative<(anonymous_namespace)::TxReconciliationState,unsigned_long,(anonymous_namespace)::TxReconciliationState>
                      ((variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        auto recon_state = m_states.find(peer_id);
        return (recon_state != m_states.end() &&
                std::holds_alternative<TxReconciliationState>(recon_state->second));
    }